

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor_test.cc
# Opt level: O1

void __thiscall xLearn::SpliterTest::TearDown(SpliterTest *this)

{
  uint uVar1;
  ulong uVar2;
  string filename;
  string local_40;
  
  uVar2 = 0;
  do {
    StringPrintf_abi_cxx11_(&local_40,"%s_%d",kTestfilename_abi_cxx11_,uVar2);
    RemoveFile(local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 != 5);
  RemoveFile(kTestfilename_abi_cxx11_);
  return;
}

Assistant:

virtual void TearDown() {
    for (int i = 0; i < kNumfolds; ++i) {
      string filename = StringPrintf("%s_%d", kTestfilename.c_str(), i);
      RemoveFile(filename.c_str());
    }
    RemoveFile(kTestfilename.c_str());
  }